

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult __thiscall
testing::internal::FloatingPointLE<float>
          (internal *this,char *expr1,char *expr2,float val1,float val2)

{
  bool bVar1;
  ostream *poVar2;
  AssertionResult *pAVar3;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar5;
  string local_3b0;
  string local_390;
  AssertionResult local_370;
  int local_35c;
  stringstream local_358 [8];
  stringstream val2_ss;
  ostream local_348 [396];
  int local_1bc;
  stringstream local_1b8 [8];
  stringstream val1_ss;
  ostream local_1a8 [376];
  FloatingPoint<float> local_30;
  FloatingPoint<float> local_2c;
  FloatingPoint<float> rhs;
  FloatingPoint<float> lhs;
  float val2_local;
  float val1_local;
  char *expr2_local;
  char *expr1_local;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  
  rhs.u_ = (FloatingPointUnion)val2;
  lhs.u_ = (FloatingPointUnion)val1;
  _val2_local = expr2;
  expr2_local = expr1;
  expr1_local = (char *)this;
  if (val2 <= val1) {
    FloatingPoint<float>::FloatingPoint(&local_2c,(float *)&lhs);
    FloatingPoint<float>::FloatingPoint(&local_30,(float *)&rhs);
    bVar1 = FloatingPoint<float>::AlmostEquals(&local_2c,&local_30);
    if (bVar1) {
      AVar5 = AssertionSuccess();
      _Var4._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           AVar5.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    else {
      std::__cxx11::stringstream::stringstream(local_1b8);
      local_1bc = (int)std::setprecision(8);
      poVar2 = std::operator<<(local_1a8,(_Setprecision)local_1bc);
      std::ostream::operator<<(poVar2,(float)lhs.u_);
      std::__cxx11::stringstream::stringstream(local_358);
      local_35c = (int)std::setprecision(8);
      poVar2 = std::operator<<(local_348,(_Setprecision)local_35c);
      std::ostream::operator<<(poVar2,(float)rhs.u_);
      AssertionFailure();
      pAVar3 = AssertionResult::operator<<(&local_370,(char (*) [12])"Expected: (");
      pAVar3 = AssertionResult::operator<<(pAVar3,&expr2_local);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [7])") <= (");
      pAVar3 = AssertionResult::operator<<(pAVar3,(char **)&val2_local);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x1b6cfd);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])0x1bb5d4);
      StringStreamToString(&local_390,(stringstream *)local_1b8);
      pAVar3 = AssertionResult::operator<<(pAVar3,&local_390);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [5])" vs ");
      StringStreamToString(&local_3b0,(stringstream *)local_358);
      pAVar3 = AssertionResult::operator<<(pAVar3,&local_3b0);
      AssertionResult::AssertionResult((AssertionResult *)this,pAVar3);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_390);
      AssertionResult::~AssertionResult(&local_370);
      std::__cxx11::stringstream::~stringstream(local_358);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      _Var4._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           extraout_RDX._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
  }
  else {
    AVar5 = AssertionSuccess();
    _Var4._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AVar5.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  AVar5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var4._M_head_impl;
  AVar5._0_8_ = this;
  return AVar5;
}

Assistant:

AssertionResult FloatingPointLE(const char* expr1,
                                const char* expr2,
                                RawType val1,
                                RawType val2) {
  // Returns success if val1 is less than val2,
  if (val1 < val2) {
    return AssertionSuccess();
  }

  // or if val1 is almost equal to val2.
  const FloatingPoint<RawType> lhs(val1), rhs(val2);
  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  // Note that the above two checks will both fail if either val1 or
  // val2 is NaN, as the IEEE floating-point standard requires that
  // any predicate involving a NaN must return false.

  ::std::stringstream val1_ss;
  val1_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val1;

  ::std::stringstream val2_ss;
  val2_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val2;

  return AssertionFailure()
      << "Expected: (" << expr1 << ") <= (" << expr2 << ")\n"
      << "  Actual: " << StringStreamToString(&val1_ss) << " vs "
      << StringStreamToString(&val2_ss);
}